

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O0

bool __thiscall
ON_BoundingBox::GetClosestPoint
          (ON_BoundingBox *this,ON_BoundingBox *other_box,ON_3dPoint *this_point,
          ON_3dPoint *other_point)

{
  ON_Interval B;
  ON_Interval A;
  bool bVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  undefined1 local_98 [7];
  bool NotEmpty;
  ON_Interval intersect;
  ON_Interval Io;
  ON_Interval It;
  undefined1 local_60 [4];
  int i;
  ON_BoundingBox b;
  ON_3dPoint *other_point_local;
  ON_3dPoint *this_point_local;
  ON_BoundingBox *other_box_local;
  ON_BoundingBox *this_local;
  
  b.m_max.z = (double)other_point;
  ON_BoundingBox((ON_BoundingBox *)local_60);
  bVar1 = IsValid(this);
  if ((bVar1) && (bVar1 = IsValid(other_box), bVar1)) {
    for (It.m_t[1]._4_4_ = 0; It.m_t[1]._4_4_ < 3; It.m_t[1]._4_4_ = It.m_t[1]._4_4_ + 1) {
      dVar3 = ON_3dPoint::operator[](&this->m_min,It.m_t[1]._4_4_);
      dVar4 = ON_3dPoint::operator[](&this->m_max,It.m_t[1]._4_4_);
      ON_Interval::ON_Interval((ON_Interval *)(Io.m_t + 1),dVar3,dVar4);
      dVar3 = ON_3dPoint::operator[](&other_box->m_min,It.m_t[1]._4_4_);
      dVar4 = ON_3dPoint::operator[](&other_box->m_max,It.m_t[1]._4_4_);
      ON_Interval::ON_Interval((ON_Interval *)(intersect.m_t + 1),dVar3,dVar4);
      ON_Interval::ON_Interval((ON_Interval *)local_98);
      A.m_t[1] = It.m_t[0];
      A.m_t[0] = Io.m_t[1];
      B.m_t[1] = Io.m_t[0];
      B.m_t[0] = intersect.m_t[1];
      bVar1 = Intersect(A,B,(ON_Interval *)local_98);
      if (bVar1) {
        dVar3 = ON_Interval::Mid((ON_Interval *)local_98);
        pdVar2 = ON_3dPoint::operator[]((ON_3dPoint *)b.m_max.z,It.m_t[1]._4_4_);
        *pdVar2 = dVar3;
        pdVar2 = ON_3dPoint::operator[](this_point,It.m_t[1]._4_4_);
        *pdVar2 = dVar3;
      }
      else {
        dVar3 = ON_3dPoint::operator[](&this->m_max,It.m_t[1]._4_4_);
        dVar4 = ON_3dPoint::operator[](&other_box->m_min,It.m_t[1]._4_4_);
        if (dVar4 <= dVar3) {
          dVar3 = ON_3dPoint::operator[](&this->m_min,It.m_t[1]._4_4_);
          pdVar2 = ON_3dPoint::operator[](this_point,It.m_t[1]._4_4_);
          *pdVar2 = dVar3;
          dVar3 = ON_3dPoint::operator[](&other_box->m_max,It.m_t[1]._4_4_);
          pdVar2 = ON_3dPoint::operator[]((ON_3dPoint *)b.m_max.z,It.m_t[1]._4_4_);
          *pdVar2 = dVar3;
        }
        else {
          dVar3 = ON_3dPoint::operator[](&this->m_max,It.m_t[1]._4_4_);
          pdVar2 = ON_3dPoint::operator[](this_point,It.m_t[1]._4_4_);
          *pdVar2 = dVar3;
          dVar3 = ON_3dPoint::operator[](&other_box->m_min,It.m_t[1]._4_4_);
          pdVar2 = ON_3dPoint::operator[]((ON_3dPoint *)b.m_max.z,It.m_t[1]._4_4_);
          *pdVar2 = dVar3;
        }
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_BoundingBox::GetClosestPoint( 
       const ON_BoundingBox& other_box, // "other" bounding box
       ON_3dPoint& this_point, // point on "this" box that is closest to "other" box
       ON_3dPoint& other_point // point on "other" box that is closest to "this" box
       )  const
{
  ON_BoundingBox b;
	if ( !IsValid() || !other_box.IsValid() )
		return false;

	for (int i=0; i<3; i++ )
  {
		ON_Interval It(m_min[i],m_max[i]);
		ON_Interval Io(other_box.m_min[i],other_box.m_max[i]);
		ON_Interval intersect;
		bool NotEmpty = Intersect(It,Io,intersect);
		if(NotEmpty)
    {
			this_point[i] = other_point[i] = intersect.Mid();
		} 
    else {
			if(m_max[i]< other_box.m_min[i] )
      {
				this_point[i] = m_max[i];
				other_point[i] = other_box.m_min[i];
			} 
      else {
				this_point[i] = m_min[i];
				other_point[i] = other_box.m_max[i];
			}
		}
	}
	return true;
}